

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_server_init(http_server_t *server,uint num_clients,uint max_clients,
                    http_client_callback_t *callback,int fd)

{
  http_client_t *phVar1;
  uint local_30;
  uint i;
  int fd_local;
  http_client_callback_t *callback_local;
  uint max_clients_local;
  uint num_clients_local;
  http_server_t *server_local;
  
  if (server == (http_server_t *)0x0) {
    __assert_fail("server != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x31,
                  "int http_server_init(http_server_t *, unsigned int, unsigned int, http_client_callback_t *, int)"
                 );
  }
  if (num_clients != 0) {
    if (fd != -1) {
      http_server_reset(server);
      phVar1 = (http_client_t *)malloc((ulong)num_clients * 0x2018);
      server->clients = phVar1;
      if (server->clients == (http_client_t *)0x0) {
        server_local._4_4_ = 0;
      }
      else {
        server->num_clients = num_clients;
        server->max_clients = max_clients;
        server->callback = callback;
        for (local_30 = 0; local_30 < server->num_clients; local_30 = local_30 + 1) {
          http_client_init(server->clients + local_30);
        }
        server->count_clients = 0;
        server->fd = fd;
        server_local._4_4_ = 1;
      }
      return server_local._4_4_;
    }
    __assert_fail("fd != -1","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",
                  0x33,
                  "int http_server_init(http_server_t *, unsigned int, unsigned int, http_client_callback_t *, int)"
                 );
  }
  __assert_fail("num_clients > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x32,
                "int http_server_init(http_server_t *, unsigned int, unsigned int, http_client_callback_t *, int)"
               );
}

Assistant:

int http_server_init(http_server_t *server,
                     unsigned int num_clients,
                     unsigned int max_clients,
                     http_client_callback_t *callback,
                     int fd) {
  assert(server != NULL);
  assert(num_clients > 0);
  assert(fd != -1);

  http_server_reset(server);
  server->clients = malloc(sizeof(http_client_t) * num_clients);
  if (server->clients == NULL)
    return 0;
  server->num_clients = num_clients;
  server->max_clients = max_clients;
  server->callback = callback;
  
  unsigned int i;
  for (i = 0; i < server->num_clients; i++) {
    http_client_init(server->clients + i);
  }
  server->count_clients = 0;
  server->fd = fd;

  return 1;
}